

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMAttrMapImpl::cloneContent(DOMAttrMapImpl *this,DOMAttrMapImpl *srcmap)

{
  bool value;
  int iVar1;
  XMLSize_t size_00;
  undefined4 extraout_var;
  DOMNodeVector *this_00;
  DOMNode *pDVar2;
  undefined4 extraout_var_00;
  DOMNodeImpl *pDVar3;
  DOMNodeImpl *this_01;
  DOMDocument *local_70;
  DOMDocumentImpl *local_68;
  DOMNode *clone;
  DOMNode *n;
  XMLSize_t i;
  DOMDocumentImpl *doc;
  XMLSize_t size;
  DOMAttrMapImpl *srcmap_local;
  DOMAttrMapImpl *this_local;
  DOMNode *p;
  
  if ((srcmap != (DOMAttrMapImpl *)0x0) && (srcmap->fNodes != (DOMNodeVector *)0x0)) {
    if (this->fNodes == (DOMNodeVector *)0x0) {
      size_00 = DOMNodeVector::size(srcmap->fNodes);
      if (size_00 != 0) {
        iVar1 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var,iVar1) == 0) {
          local_68 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_68 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar1) + -8);
        }
        this_00 = (DOMNodeVector *)operator_new(0x18,local_68);
        local_70 = (DOMDocument *)0x0;
        if (local_68 != (DOMDocumentImpl *)0x0) {
          local_70 = &local_68->super_DOMDocument;
        }
        DOMNodeVector::DOMNodeVector(this_00,local_70,size_00);
        this->fNodes = this_00;
      }
    }
    else {
      DOMNodeVector::reset(this->fNodes);
    }
    for (n = (DOMNode *)0x0; pDVar2 = (DOMNode *)DOMNodeVector::size(srcmap->fNodes), n < pDVar2;
        n = (DOMNode *)((long)&n->_vptr_DOMNode + 1)) {
      pDVar2 = DOMNodeVector::elementAt(srcmap->fNodes,(XMLSize_t)n);
      iVar1 = (*pDVar2->_vptr_DOMNode[0xd])(pDVar2,1);
      p = (DOMNode *)CONCAT44(extraout_var_00,iVar1);
      pDVar3 = xercesc_4_0::castToNodeImpl(p);
      this_01 = xercesc_4_0::castToNodeImpl(pDVar2);
      value = DOMNodeImpl::isSpecified(this_01);
      DOMNodeImpl::isSpecified(pDVar3,value);
      pDVar2 = this->fOwnerNode;
      pDVar3 = xercesc_4_0::castToNodeImpl(p);
      pDVar3->fOwnerNode = pDVar2;
      pDVar3 = xercesc_4_0::castToNodeImpl(p);
      DOMNodeImpl::isOwned(pDVar3,true);
      DOMNodeVector::addElement(this->fNodes,p);
    }
  }
  return;
}

Assistant:

void DOMAttrMapImpl::cloneContent(const DOMAttrMapImpl *srcmap)
{
    if ((srcmap != 0) && (srcmap->fNodes != 0))
    {
        if (fNodes != 0)
            fNodes->reset();
        else
        {
            XMLSize_t size = srcmap->fNodes->size();
            if(size > 0) {
                DOMDocumentImpl *doc = (DOMDocumentImpl*)fOwnerNode->getOwnerDocument();
                fNodes = new (doc) DOMNodeVector(doc, size);
            }
        }

        for (XMLSize_t i = 0; i < srcmap->fNodes->size(); i++)
        {
            DOMNode *n = srcmap->fNodes->elementAt(i);
            DOMNode *clone = n->cloneNode(true);
            castToNodeImpl(clone)->isSpecified(castToNodeImpl(n)->isSpecified());
            castToNodeImpl(clone)->fOwnerNode = fOwnerNode;
            castToNodeImpl(clone)->isOwned(true);
            fNodes->addElement(clone);
        }
    }
}